

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O0

void __thiscall rsg::VariableScope::~VariableScope(VariableScope *this)

{
  Variable *pVVar1;
  bool bVar2;
  reference ppVVar3;
  __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_38;
  __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_30;
  iterator i_1;
  __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_20;
  __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_18;
  iterator i;
  VariableScope *this_local;
  
  i._M_current = (Variable **)this;
  local_18._M_current =
       (Variable **)
       std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin
                 (&this->m_declaredVariables);
  while( true ) {
    local_20._M_current =
         (Variable **)
         std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::end
                   (&this->m_declaredVariables);
    bVar2 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar2) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
              ::operator*(&local_18);
    pVVar1 = *ppVVar3;
    if (pVVar1 != (Variable *)0x0) {
      Variable::~Variable(pVVar1);
      operator_delete(pVVar1,0x80);
    }
    i_1._M_current =
         (Variable **)
         __gnu_cxx::
         __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
         ::operator++(&local_18,0);
  }
  local_30._M_current =
       (Variable **)
       std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin(&this->m_liveVariables)
  ;
  while( true ) {
    local_38._M_current =
         (Variable **)
         std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::end(&this->m_liveVariables)
    ;
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar2) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
              ::operator*(&local_30);
    pVVar1 = *ppVVar3;
    if (pVVar1 != (Variable *)0x0) {
      Variable::~Variable(pVVar1);
      operator_delete(pVVar1,0x80);
    }
    __gnu_cxx::
    __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
    ::operator++(&local_30,0);
  }
  std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::~vector(&this->m_liveVariables);
  std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::~vector
            (&this->m_declaredVariables);
  return;
}

Assistant:

VariableScope::~VariableScope (void)
{
	for (vector<Variable*>::iterator i = m_declaredVariables.begin(); i != m_declaredVariables.end(); i++)
		delete *i;

	for (vector<Variable*>::iterator i = m_liveVariables.begin(); i != m_liveVariables.end(); i++)
		delete *i;
}